

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O2

int __thiscall mpt::pipe<char>::pipe(pipe<char> *this,int *__pipedes)

{
  bool bVar1;
  int in_EAX;
  reference<mpt::pipe<char>::instance> *prVar2;
  undefined8 uVar3;
  undefined7 extraout_var;
  long in_RDX;
  long lVar4;
  
  (this->_d)._ref = (instance *)0x0;
  if (0 < in_RDX) {
    prVar2 = ref(this);
    uVar3 = (**(code **)(*(long *)&prVar2->_ref->super_type + 0x40))();
    lVar4 = in_RDX + 1;
    while( true ) {
      in_EAX = (int)uVar3;
      lVar4 = lVar4 + -1;
      if (lVar4 == 0) break;
      bVar1 = push(this,(char *)__pipedes);
      uVar3 = CONCAT71(extraout_var,bVar1);
    }
  }
  return in_EAX;
}

Assistant:

bool pop(T *data = 0) const
	{
		io::queue *d;
		if (!(d = _d.instance())) {
			return false;
		}
		uint8_t buf[sizeof(T)];
		T *t = static_cast<T *>(static_cast<void *>(buf));
		if (!d->pop(t, sizeof(T))) {
			return false;
		}
		if (data) {
			*data = *t;
		} else {
			t->~T();
		}
		return true;
	}